

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

void Curl_conn_forget_socket(Curl_easy *data,int sockindex)

{
  Curl_cft_cntrl *pCVar1;
  connectdata *pcVar2;
  Curl_cfilter *pCVar3;
  
  pcVar2 = data->conn;
  if (pcVar2 != (connectdata *)0x0) {
    pCVar3 = pcVar2->cfilter[sockindex];
    if (pCVar3 != (Curl_cfilter *)0x0) {
      do {
        pCVar1 = pCVar3->cft->cntrl;
        if (pCVar1 != Curl_cf_def_cntrl) {
          (*pCVar1)(pCVar3,data,0x101,0,(void *)0x0);
        }
        pCVar3 = pCVar3->next;
      } while (pCVar3 != (Curl_cfilter *)0x0);
      pcVar2 = data->conn;
    }
    pcVar2->sock[sockindex] = -1;
  }
  return;
}

Assistant:

void Curl_conn_forget_socket(struct Curl_easy *data, int sockindex)
{
  if(data->conn) {
    struct Curl_cfilter *cf = data->conn->cfilter[sockindex];
    if(cf)
      (void)Curl_conn_cf_cntrl(cf, data, TRUE,
                               CF_CTRL_FORGET_SOCKET, 0, NULL);
    fake_sclose(data->conn->sock[sockindex]);
    data->conn->sock[sockindex] = CURL_SOCKET_BAD;
  }
}